

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

bool __thiscall GGSock::FileServer::clearFile(FileServer *this,TURI *uri)

{
  ulong *puVar1;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  long lVar3;
  long lVar4;
  pointer __s2;
  size_t sVar5;
  size_t __n;
  byte bVar6;
  int iVar7;
  uint uVar8;
  pthread_mutex_t *__mutex;
  ulong uVar9;
  long lVar10;
  long *local_98 [2];
  long local_88 [2];
  undefined8 local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined4 local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  _Var2._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  lVar3 = *(long *)&((_Var2._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
  uVar8 = (*(int *)&((_Bit_iterator *)((long)&(_Var2._M_head_impl)->fileUsed + 0x10))->
                    super__Bit_iterator_base - (int)lVar3) * 8 +
          *(uint *)((long)&(_Var2._M_head_impl)->fileUsed + 0x18);
  if (0 < (int)uVar8) {
    lVar4 = *(long *)&((_Var2._M_head_impl)->files).
                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
    ;
    __s2 = (uri->_M_dataplus)._M_p;
    sVar5 = uri->_M_string_length;
    lVar10 = 0;
    uVar9 = 0;
    do {
      __n = *(size_t *)(lVar4 + 8 + lVar10);
      if ((__n == sVar5) &&
         ((__n == 0 || (iVar7 = bcmp(*(void **)(lVar4 + lVar10),__s2,__n), iVar7 == 0)))) {
        bVar6 = (byte)uVar9 & 0x3f;
        puVar1 = (ulong *)(lVar3 + (uVar9 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"?","");
        local_78 = 0;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"?","");
        local_50 = 0;
        local_48 = (void *)0x0;
        uStack_40 = 0;
        local_38 = 0;
        lVar4 = *(long *)&(((this->m_impl)._M_t.
                            super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                            .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)
                          ->files).
                          super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
        ;
        std::__cxx11::string::operator=((string *)(lVar4 + lVar10),(string *)local_98);
        lVar3 = lVar4 + lVar10;
        *(undefined8 *)(lVar3 + 0x20) = local_78;
        std::__cxx11::string::operator=((string *)(lVar3 + 0x28),(string *)local_70);
        *(undefined4 *)(lVar3 + 0x48) = local_50;
        std::vector<char,_std::allocator<char>_>::_M_move_assign
                  ((vector<char,_std::allocator<char>_> *)(lVar4 + lVar10 + 0x50),&local_48);
        if (local_48 != (void *)0x0) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        break;
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x68;
    } while (uVar9 < uVar8);
  }
  ((this->m_impl)._M_t.
   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
   _M_t.
   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->changedFileInfos = true;
  pthread_mutex_unlock(__mutex);
  return true;
}

Assistant:

bool FileServer::clearFile(const TURI & uri) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            if (m_impl->files[i].info.uri != uri) {
                continue;
            }
            m_impl->fileUsed[i] = false;
            m_impl->files[i] = {};

            break;
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}